

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase694::run(TestCase694 *this)

{
  size_t sVar1;
  word *pwVar2;
  size_t sVar3;
  word *pwVar4;
  bool bVar5;
  ArrayPtr<const_unsigned_int> value;
  Reader value_00;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar6;
  uint local_174;
  Builder local_170;
  Builder root;
  OrphanBuilder local_130;
  MallocMessageBuilder builder;
  
  MallocMessageBuilder::MallocMessageBuilder(&builder,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAllTypes>
            (&root,&builder.super_MessageBuilder);
  AVar6 = MessageBuilder::getSegmentsForOutput(&builder.super_MessageBuilder);
  sVar1 = (AVar6.ptr)->size_;
  pwVar2 = (AVar6.ptr)->ptr;
  local_170._0_8_ = 0x220000000c;
  local_170.content.ptr._0_4_ = 0x38;
  value.size_ = 3;
  value.ptr = (uint *)&local_170;
  capnproto_test::capnp::test::TestAllTypes::Builder::setUInt32List(&root,value);
  AVar6 = MessageBuilder::getSegmentsForOutput(&builder.super_MessageBuilder);
  sVar3 = (AVar6.ptr)->size_;
  pwVar4 = (AVar6.ptr)->ptr;
  value_00.super_StringPtr.content.size_ = 4;
  value_00.super_StringPtr.content.ptr = "foo";
  capnproto_test::capnp::test::TestAllTypes::Builder::setTextField(&root,value_00);
  AVar6 = MessageBuilder::getSegmentsForOutput(&builder.super_MessageBuilder);
  if ((AVar6.size_ != 1) && (kj::_::Debug::minSeverity < 3)) {
    local_174 = 1;
    AVar6 = MessageBuilder::getSegmentsForOutput(&builder.super_MessageBuilder);
    local_170._0_8_ = AVar6.size_;
    kj::_::Debug::log<char_const(&)[65],unsigned_int,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x2c0,ERROR,
               "\"failed: expected \" \"(1u) == (builder.getSegmentsForOutput().size())\", 1u, builder.getSegmentsForOutput().size()"
               ,(char (*) [65])"failed: expected (1u) == (builder.getSegmentsForOutput().size())",
               &local_174,(unsigned_long *)&local_170);
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::disownUInt32List
            ((Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_> *)&local_130,&root);
  OrphanBuilder::~OrphanBuilder(&local_130);
  bVar5 = allZero(pwVar2 + sVar1,pwVar4 + sVar3);
  if ((!bVar5) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[47]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x2c4,ERROR,"\"failed: expected \" \"allZero(zerosStart, zerosEnd)\"",
               (char (*) [47])"failed: expected allZero(zerosStart, zerosEnd)");
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getTextField(&local_170,&root);
  bVar5 = operator==("foo",&local_170);
  if (!bVar5 && kj::_::Debug::minSeverity < 3) {
    capnproto_test::capnp::test::TestAllTypes::Builder::getTextField(&local_170,&root);
    kj::_::Debug::log<char_const(&)[50],char_const(&)[4],capnp::Text::Builder>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x2c6,ERROR,
               "\"failed: expected \" \"(\\\"foo\\\") == (root.getTextField())\", \"foo\", root.getTextField()"
               ,(char (*) [50])"failed: expected (\"foo\") == (root.getTextField())",
               (char (*) [4])"foo",&local_170);
  }
  MallocMessageBuilder::~MallocMessageBuilder(&builder);
  return;
}

Assistant:

TEST(Orphans, ListsZerodAfterUse) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<TestAllTypes>();

  const word* zerosStart = builder.getSegmentsForOutput()[0].end();
  root.setUInt32List({12, 34, 56});
  const word* zerosEnd = builder.getSegmentsForOutput()[0].end();

  root.setTextField("foo");  // guard against overruns

  EXPECT_EQ(1u, builder.getSegmentsForOutput().size());  // otherwise test is invalid

  root.disownUInt32List();

  EXPECT_TRUE(allZero(zerosStart, zerosEnd));

  EXPECT_EQ("foo", root.getTextField());
}